

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O2

SignatureData *
DataFromTransaction(SignatureData *__return_storage_ptr__,CMutableTransaction *tx,uint nIn,
                   CTxOut *txout)

{
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *this;
  long lVar1;
  pointer pCVar2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var3;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var4;
  pointer pvVar5;
  pointer pvVar6;
  bool bVar7;
  TxoutType TVar8;
  ulong uVar9;
  size_type sVar10;
  CScriptWitness *witness;
  long lVar11;
  CScript *this_00;
  iterator __begin2;
  pointer scriptSig;
  uint uVar12;
  CScript *other;
  ulong uVar13;
  long in_FS_OFFSET;
  SigVersion local_168;
  iterator __end2;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  solutions;
  SignatureExtractorChecker extractor_checker;
  MutableTransactionSignatureChecker tx_checker;
  Stacks stack;
  CScript redeem_script;
  CKeyID local_6c;
  CScript next_script;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SignatureData::SignatureData(__return_storage_ptr__);
  pCVar2 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar9 = (ulong)nIn;
  if ((ulong)(((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pCVar2) / 0x68) <= uVar9) {
    __assert_fail("tx.vin.size() > nIn",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/sign.cpp"
                  ,0x265,
                  "SignatureData DataFromTransaction(const CMutableTransaction &, unsigned int, const CTxOut &)"
                 );
  }
  this_00 = &__return_storage_ptr__->scriptSig;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&this_00->super_CScriptBase,&pCVar2[uVar9].scriptSig.super_CScriptBase);
  witness = &__return_storage_ptr__->scriptWitness;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&witness->stack,
              &(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9].scriptWitness.stack);
  this = &stack.witness;
  stack.script.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stack.script.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  stack.script.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector(this,&witness->stack);
  redeem_script.super_CScriptBase._union.indirect_contents.indirect =
       (char *)&PTR_CheckECDSASignature_0114c3f0;
  EvalScript(&stack.script,this_00,2,(BaseSignatureChecker *)&redeem_script,BASE,(ScriptError *)0x0)
  ;
  extractor_checker.super_DeferringSignatureChecker.m_checker =
       &tx_checker.super_BaseSignatureChecker;
  tx_checker.super_BaseSignatureChecker._vptr_BaseSignatureChecker =
       (_func_int **)&PTR_CheckECDSASignature_0114a720;
  tx_checker.m_mdb = FAIL;
  tx_checker.amount = txout->nValue;
  tx_checker.txdata = (PrecomputedTransactionData *)0x0;
  extractor_checker.super_DeferringSignatureChecker.super_BaseSignatureChecker.
  _vptr_BaseSignatureChecker = (_func_int **)&PTR_CheckECDSASignature_01158c90;
  other = &txout->scriptPubKey;
  extractor_checker.sigdata = __return_storage_ptr__;
  tx_checker.txTo = tx;
  tx_checker.nIn = nIn;
  bVar7 = VerifyScript(this_00,other,witness,0x1fffdf,(BaseSignatureChecker *)&extractor_checker,
                       (ScriptError *)0x0);
  if (bVar7) {
    __return_storage_ptr__->complete = true;
    goto LAB_00ae1ae5;
  }
  solutions.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  solutions.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  solutions.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar8 = Solver(other,&solutions);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            (&next_script.super_CScriptBase,&other->super_CScriptBase);
  if (TVar8 == SCRIPTHASH) {
    if (stack.script.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        stack.script.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      _Var3._M_current =
           stack.script.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      _Var4._M_current =
           stack.script.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (_Var3._M_current != _Var4._M_current) {
        prevector<28U,_unsigned_char,_unsigned_int,_int>::
        prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  (&redeem_script.super_CScriptBase,_Var3,_Var4);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&(__return_storage_ptr__->redeem_script).super_CScriptBase,
                   &redeem_script.super_CScriptBase);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&next_script.super_CScriptBase,&redeem_script.super_CScriptBase);
        TVar8 = Solver((CScript *)&next_script.super_CScriptBase,&solutions);
        stack.script.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             stack.script.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&(stack.script.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  (&redeem_script.super_CScriptBase);
        goto LAB_00ae1903;
      }
    }
  }
  else {
LAB_00ae1903:
    local_168 = BASE;
    if (TVar8 == WITNESS_V0_SCRIPTHASH) {
      if (stack.witness.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          stack.witness.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        _Var3._M_current =
             stack.witness.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        _Var4._M_current =
             stack.witness.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (_Var3._M_current != _Var4._M_current) {
          prevector<28U,_unsigned_char,_unsigned_int,_int>::
          prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    (&redeem_script.super_CScriptBase,_Var3,_Var4);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                    (&(__return_storage_ptr__->witness_script).super_CScriptBase,
                     &redeem_script.super_CScriptBase);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                    (&next_script.super_CScriptBase,&redeem_script.super_CScriptBase);
          TVar8 = Solver((CScript *)&next_script.super_CScriptBase,&solutions);
          stack.witness.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               stack.witness.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&(stack.witness.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::_M_move_assign(&stack.script,this);
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::clear(this);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                    (&redeem_script.super_CScriptBase);
          local_168 = WITNESS_V0;
          goto LAB_00ae19c5;
        }
      }
    }
    else {
LAB_00ae19c5:
      pvVar6 = stack.script.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((TVar8 == MULTISIG) &&
         (stack.script.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          stack.script.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        uVar9 = ((long)solutions.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)solutions.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18;
        if (uVar9 < 2) {
          __assert_fail("solutions.size() > 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/sign.cpp"
                        ,0x291,
                        "SignatureData DataFromTransaction(const CMutableTransaction &, unsigned int, const CTxOut &)"
                       );
        }
        uVar12 = 0;
        for (scriptSig = stack.script.
                         super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; scriptSig != pvVar6;
            scriptSig = scriptSig + 1) {
          uVar13 = (ulong)uVar12;
          lVar11 = uVar13 * 0x18;
          do {
            pvVar5 = solutions.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((int)uVar9 - 2 <= uVar13) goto LAB_00ae1ac0;
            CPubKey::Set<unsigned_char_const*>
                      ((CPubKey *)&redeem_script,
                       *(uchar **)
                        ((long)&solutions.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar11),
                       *(uchar **)
                        ((long)&solutions.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish + lVar11));
            CPubKey::GetID(&local_6c,(CPubKey *)&redeem_script);
            sVar10 = std::
                     map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                     ::count(&__return_storage_ptr__->signatures,&local_6c);
            if (sVar10 != 0) {
              uVar13 = (ulong)((int)uVar13 + 1);
              break;
            }
            bVar7 = anon_unknown.dwarf_3f75e69::SignatureExtractorChecker::CheckECDSASignature
                              (&extractor_checker,scriptSig,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               ((long)&pvVar5[1].
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar11),
                               &next_script,local_168);
            uVar13 = uVar13 + 1;
            lVar11 = lVar11 + 0x18;
          } while (!bVar7);
          uVar12 = (uint)uVar13;
LAB_00ae1ac0:
        }
      }
    }
  }
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&next_script.super_CScriptBase);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&solutions);
LAB_00ae1ae5:
  anon_unknown.dwarf_3f75e69::Stacks::~Stacks(&stack);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

SignatureData DataFromTransaction(const CMutableTransaction& tx, unsigned int nIn, const CTxOut& txout)
{
    SignatureData data;
    assert(tx.vin.size() > nIn);
    data.scriptSig = tx.vin[nIn].scriptSig;
    data.scriptWitness = tx.vin[nIn].scriptWitness;
    Stacks stack(data);

    // Get signatures
    MutableTransactionSignatureChecker tx_checker(&tx, nIn, txout.nValue, MissingDataBehavior::FAIL);
    SignatureExtractorChecker extractor_checker(data, tx_checker);
    if (VerifyScript(data.scriptSig, txout.scriptPubKey, &data.scriptWitness, STANDARD_SCRIPT_VERIFY_FLAGS, extractor_checker)) {
        data.complete = true;
        return data;
    }

    // Get scripts
    std::vector<std::vector<unsigned char>> solutions;
    TxoutType script_type = Solver(txout.scriptPubKey, solutions);
    SigVersion sigversion = SigVersion::BASE;
    CScript next_script = txout.scriptPubKey;

    if (script_type == TxoutType::SCRIPTHASH && !stack.script.empty() && !stack.script.back().empty()) {
        // Get the redeemScript
        CScript redeem_script(stack.script.back().begin(), stack.script.back().end());
        data.redeem_script = redeem_script;
        next_script = std::move(redeem_script);

        // Get redeemScript type
        script_type = Solver(next_script, solutions);
        stack.script.pop_back();
    }
    if (script_type == TxoutType::WITNESS_V0_SCRIPTHASH && !stack.witness.empty() && !stack.witness.back().empty()) {
        // Get the witnessScript
        CScript witness_script(stack.witness.back().begin(), stack.witness.back().end());
        data.witness_script = witness_script;
        next_script = std::move(witness_script);

        // Get witnessScript type
        script_type = Solver(next_script, solutions);
        stack.witness.pop_back();
        stack.script = std::move(stack.witness);
        stack.witness.clear();
        sigversion = SigVersion::WITNESS_V0;
    }
    if (script_type == TxoutType::MULTISIG && !stack.script.empty()) {
        // Build a map of pubkey -> signature by matching sigs to pubkeys:
        assert(solutions.size() > 1);
        unsigned int num_pubkeys = solutions.size()-2;
        unsigned int last_success_key = 0;
        for (const valtype& sig : stack.script) {
            for (unsigned int i = last_success_key; i < num_pubkeys; ++i) {
                const valtype& pubkey = solutions[i+1];
                // We either have a signature for this pubkey, or we have found a signature and it is valid
                if (data.signatures.count(CPubKey(pubkey).GetID()) || extractor_checker.CheckECDSASignature(sig, pubkey, next_script, sigversion)) {
                    last_success_key = i + 1;
                    break;
                }
            }
        }
    }

    return data;
}